

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O2

int FmsMeshAddComponent(FmsMesh mesh,char *comp_name,FmsComponent *comp)

{
  ulong uVar1;
  int iVar2;
  FmsInt FVar3;
  FmsComponent *__ptr;
  FmsComponent str_copy_p;
  int iVar4;
  
  if (mesh == (FmsMesh)0x0) {
    iVar4 = 1;
  }
  else if (comp == (FmsComponent *)0x0) {
    iVar4 = 2;
  }
  else {
    uVar1 = mesh->num_comps;
    __ptr = mesh->comps;
    FVar3 = NextPow2(uVar1 + 1);
    iVar4 = 3;
    if (uVar1 <= FVar3 >> 1) {
      __ptr = (FmsComponent *)realloc(__ptr,FVar3 << 3);
      if (__ptr == (FmsComponent *)0x0) {
        return 3;
      }
      mesh->comps = __ptr;
    }
    str_copy_p = (FmsComponent)calloc(1,0x48);
    if (str_copy_p != (FmsComponent)0x0) {
      iVar2 = FmsCopyString(comp_name,(char **)str_copy_p);
      if (iVar2 == 0) {
        str_copy_p->id = uVar1;
        str_copy_p->dim = 0x7f;
        __ptr[uVar1] = str_copy_p;
        mesh->num_comps = uVar1 + 1;
        *comp = str_copy_p;
        iVar4 = 0;
      }
      else {
        free(str_copy_p);
      }
    }
  }
  return iVar4;
}

Assistant:

int FmsMeshAddComponent(FmsMesh mesh, const char *comp_name,
                        FmsComponent *comp) {
  if (!mesh) { E_RETURN(1); }
  if (!comp) { E_RETURN(2); }
  FmsInt num_comps = mesh->num_comps;
  FmsComponent *comps = mesh->comps;
  // Reallocate mesh->comps, if necessary
  FmsInt nc = NextPow2(num_comps+1);
  if (num_comps <= nc/2) {
    comps = realloc(comps, nc*sizeof(*comps));
    if (comps == NULL) { E_RETURN(3); }
    mesh->comps = comps;
  }
  FmsComponent component;
  component = calloc(1, sizeof(*component));
  if (component == NULL) { E_RETURN(3); }
  // On error, call free(component)
  if (FmsCopyString(comp_name, &component->name)) {
    free(component); E_RETURN(3);
  }
  component->id = num_comps;
  component->dim = FMS_INVALID_DIM;
  comps[num_comps] = component;
  mesh->num_comps = num_comps+1;
  *comp = component;
  return 0;
}